

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O1

void run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,unsigned_int,double>
               (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *A,vector<unsigned_int,_std::allocator<unsigned_int>_> *B_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *B_cols,
               vector<double,_std::allocator<double>_> *B_values)

{
  pointer puVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer puVar4;
  stored_size_type sVar5;
  pointer ppVar6;
  pointer pdVar7;
  stored_size_type *psVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint *puVar14;
  uint *puVar15;
  long lVar16;
  size_type __new_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pfVar2 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(A->
                 super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2;
  if (lVar10 == 0) {
    __new_size = 0;
  }
  else {
    lVar10 = (lVar10 >> 3) * -0x5555555555555555;
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    psVar8 = (stored_size_type *)((long)&(pfVar2->m_flat_tree).m_data.m_seq + 8);
    __new_size = 0;
    do {
      __new_size = __new_size + *psVar8;
      psVar8 = psVar8 + 3;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(B_cols,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(B_values,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (B_rows,((long)(A->
                           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(A->
                           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                    1);
  pfVar2 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pfVar3 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pfVar3 - (long)pfVar2 >> 3;
  lVar9 = lVar10 * -0x5555555555555555;
  if (pfVar3 != pfVar2) {
    puVar4 = (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      sVar5 = pfVar2[lVar13].m_flat_tree.m_data.m_seq.m_holder.m_size;
      if (sVar5 != 0) {
        ppVar6 = pfVar2[lVar13].m_flat_tree.m_data.m_seq.m_holder.m_start;
        lVar16 = 0;
        do {
          puVar1 = puVar4 + *(uint *)((long)&ppVar6->first + lVar16);
          *puVar1 = *puVar1 + 1;
          lVar16 = lVar16 + 0x10;
        } while (sVar5 << 4 != lVar16);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar9 + (ulong)(lVar9 == 0));
  }
  if (pfVar3 == pfVar2) {
    uVar11 = 0;
  }
  else {
    puVar4 = (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    uVar12 = 0;
    do {
      uVar11 = puVar4[lVar13] + uVar12;
      puVar4[lVar13] = uVar12;
      lVar13 = lVar13 + 1;
      uVar12 = uVar11;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar13);
  }
  (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start[lVar10 * -0x1555555555555555] = uVar11;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,B_rows);
  pfVar2 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(A->
                 super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2;
  if (lVar10 != 0) {
    lVar10 = (lVar10 >> 3) * -0x5555555555555555;
    puVar4 = (B_cols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (B_values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      sVar5 = *(stored_size_type *)((long)&pfVar2[lVar9].m_flat_tree.m_data.m_seq + 8);
      if (sVar5 != 0) {
        puVar15 = *(uint **)&pfVar2[lVar9].m_flat_tree.m_data.m_seq;
        puVar14 = puVar15 + sVar5 * 4;
        do {
          uVar11 = *puVar15;
          uVar12 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          puVar4[uVar12] = (uint)lVar9;
          pdVar7[uVar12] = *(double *)(puVar15 + 2);
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] =
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11] + 1;
          puVar15 = puVar15 + 4;
        } while (puVar15 != puVar14);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar10 + (ulong)(lVar10 == 0));
  }
  do_nothing(B_rows,B_cols,B_values);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run(std::vector<RowT> const & A,
         std::vector<IndexT> & B_rows,
         std::vector<IndexT> & B_cols,
         std::vector<NumericT> & B_values)
{
  std::size_t B_nnz = 0;

  for (std::size_t i = 0; i < A.size(); ++i)
    B_nnz += A[i].size();

  // initialize datastructures for B:
  B_cols.resize(B_nnz);    // note: initialization with zero not strictly required
  B_values.resize(B_nnz);  // note: initialization with zero not strictly required
  B_rows.resize(A.size() + 1);

  //
  // Stage 1: Compute nonzero pattern for B
  //
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
      B_rows[it->first] += 1;
  }

  // Bring row-start array in place using exclusive-scan:
  IndexT offset = 0;
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    IndexT tmp = B_rows[row];
    B_rows[row] = offset;
    offset += tmp;
  }
  B_rows[A.size()] = offset;


  //
  // Stage 2: Fill with data
  //
  std::vector<IndexT> B_offsets(B_rows); // index of first unwritten element per row

  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
    {
      IndexT col_in_A = it->first;
      IndexT B_nnz_index = B_offsets[col_in_A];
      B_cols[B_nnz_index] = row;
      B_values[B_nnz_index] = it->second;
      B_offsets[col_in_A] += 1;
    }
  }

  do_nothing(B_rows, B_cols, B_values);
}